

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

void __thiscall
libtorrent::aux::torrent::bytes_done(torrent *this,torrent_status *st,status_flags_t flags)

{
  piece_index_t index;
  uint uVar1;
  uint uVar2;
  int64_t iVar3;
  element_type *this_00;
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> this_01;
  bool bVar4;
  download_priority_t dVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int *piVar11;
  vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
  dl_queue;
  piece_count local_50;
  int64_t local_38;
  
  st->total_done = 0;
  st->total_wanted_done = 0;
  iVar3 = (this->super_torrent_hot_members).m_size_on_disk;
  st->total_wanted = iVar3;
  this_00 = (this->super_torrent_hot_members).m_torrent_file.
            super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((this_00->m_files).m_piece_length < 1) {
    return;
  }
  if (((this->field_0x5cc & 4) != 0) || (bVar4 = is_seed(this), bVar4)) {
    st->total_done = (this_00->m_files).m_total_size - this->m_padding_bytes;
    st->total_wanted_done = iVar3;
  }
  else {
    this_01._M_head_impl =
         (this->super_torrent_hot_members).m_picker._M_t.
         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
         ._M_t.
         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl;
    if (this_01._M_head_impl != (piece_picker *)0x0) {
      piece_picker::want(&local_50,this_01._M_head_impl);
      lVar8 = (long)local_50.num_pieces;
      lVar10 = (long)(this_00->m_files).m_piece_length;
      if (local_50.last_piece == true) {
        iVar6 = file_storage::piece_size
                          (&this_00->m_files,(piece_index_t)((this_00->m_files).m_num_pieces + -1));
        lVar7 = lVar10 - iVar6;
      }
      else {
        lVar7 = 0;
      }
      lVar10 = lVar10 * lVar8 - (local_50.pad_bytes + lVar7);
      lVar8 = (this->super_torrent_hot_members).m_size_on_disk;
      if (lVar8 <= lVar10) {
        lVar10 = lVar8;
      }
      st->total_wanted = lVar10;
      local_38 = (this->m_file_progress).m_total_on_disk;
      piece_picker::have_want
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl);
      lVar8 = (long)local_50.num_pieces;
      lVar10 = (long)(this_00->m_files).m_piece_length;
      if (local_50.last_piece == true) {
        iVar6 = file_storage::piece_size
                          (&this_00->m_files,(piece_index_t)((this_00->m_files).m_num_pieces + -1));
        lVar7 = lVar10 - iVar6;
      }
      else {
        lVar7 = 0;
      }
      lVar8 = lVar10 * lVar8 - (local_50.pad_bytes + lVar7);
      if (local_38 <= lVar8) {
        lVar8 = local_38;
      }
      st->total_wanted_done = lVar8;
      piece_picker::have((this->super_torrent_hot_members).m_picker._M_t.
                         super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                         .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl
                        );
      lVar8 = (long)local_50.num_pieces;
      lVar10 = (long)(this_00->m_files).m_piece_length;
      if (local_50.last_piece == true) {
        iVar6 = file_storage::piece_size
                          (&this_00->m_files,(piece_index_t)((this_00->m_files).m_num_pieces + -1));
        lVar7 = lVar10 - iVar6;
      }
      else {
        lVar7 = 0;
      }
      st->total_done = lVar10 * lVar8 - (local_50.pad_bytes + lVar7);
      piece_picker::all_pieces
                ((this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl);
      lVar8 = (long)local_50.num_pieces;
      lVar10 = (long)(this_00->m_files).m_piece_length;
      if (local_50.last_piece == true) {
        iVar6 = file_storage::piece_size
                          (&this_00->m_files,(piece_index_t)((this_00->m_files).m_num_pieces + -1));
        lVar7 = lVar10 - iVar6;
      }
      else {
        lVar7 = 0;
      }
      st->total = lVar10 * lVar8 - (local_50.pad_bytes + lVar7);
      if ((flags.m_val & 2) == 0) {
        return;
      }
      piece_picker::get_download_queue
                ((vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>
                  *)&local_50,
                 (this->super_torrent_hot_members).m_picker._M_t.
                 super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                 .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl);
      piVar11 = (int *)CONCAT44(local_50._4_4_,local_50.num_pieces);
      if (piVar11 != (int *)local_50.pad_bytes) {
        do {
          index.m_val = *piVar11;
          bVar4 = piece_picker::have_piece
                            ((this->super_torrent_hot_members).m_picker._M_t.
                             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                             _M_head_impl,index);
          if (!bVar4) {
            uVar1 = *(uint *)((long)piVar11 + 6);
            iVar6 = piece_picker::pad_bytes_in_piece
                              ((this->super_torrent_hot_members).m_picker._M_t.
                               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                               _M_head_impl,index);
            uVar2 = (((this->super_torrent_hot_members).m_torrent_file.
                      super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->m_files).m_piece_length;
            uVar9 = 0x4000;
            if (uVar2 < 0x4000) {
              uVar9 = uVar2;
            }
            if ((int)uVar2 < 1) {
              uVar9 = 0x4000;
            }
            lVar8 = (ulong)uVar9 *
                    (long)(int)(((uVar1 >> 0x10 & 0x7fff) + (uVar1 & 0x7fff)) - iVar6 / (int)uVar9);
            st->total_done = st->total_done + lVar8;
            dVar5 = piece_picker::piece_priority
                              ((this->super_torrent_hot_members).m_picker._M_t.
                               super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
                               .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>.
                               _M_head_impl,index);
            if (dVar5.m_val != '\0') {
              st->total_wanted_done = st->total_wanted_done + lVar8;
            }
          }
          piVar11 = piVar11 + 3;
        } while (piVar11 != (int *)local_50.pad_bytes);
        piVar11 = (int *)CONCAT44(local_50._4_4_,local_50.num_pieces);
      }
      if (piVar11 == (int *)0x0) {
        return;
      }
      operator_delete(piVar11,CONCAT71(local_50._17_7_,local_50.last_piece) - (long)piVar11);
      return;
    }
    st->total_done = 0;
    st->total_wanted_done = 0;
  }
  st->total_wanted = iVar3;
  return;
}

Assistant:

void torrent::bytes_done(torrent_status& st, status_flags_t const flags) const
	{
		INVARIANT_CHECK;

		st.total_done = 0;
		st.total_wanted_done = 0;
		st.total_wanted = m_size_on_disk;

		TORRENT_ASSERT(st.total_wanted <= m_torrent_file->total_size());
		TORRENT_ASSERT(st.total_wanted >= 0);

		TORRENT_ASSERT(!valid_metadata() || m_torrent_file->num_pieces() > 0);
		if (!valid_metadata()) return;

		if (m_seed_mode || is_seed())
		{
			// once we're a seed and remove the piece picker, we stop tracking
			// piece- and file priority. We consider everything as being
			// "wanted"
			st.total_done = m_torrent_file->total_size() - m_padding_bytes;
			st.total_wanted_done = m_size_on_disk;
			st.total_wanted = m_size_on_disk;
			TORRENT_ASSERT(st.total_wanted <= st.total_done);
			TORRENT_ASSERT(st.total_wanted_done <= st.total_wanted);
			TORRENT_ASSERT(st.total_done <= m_torrent_file->total_size());
			return;
		}
		else if (!has_picker())
		{
			st.total_done = 0;
			st.total_wanted_done = 0;
			st.total_wanted = m_size_on_disk;
			return;
		}

		TORRENT_ASSERT(has_picker());

		file_storage const& files = m_torrent_file->files();

		st.total_wanted = std::min(m_size_on_disk, calc_bytes(files, m_picker->want()));
		st.total_wanted_done = std::min(m_file_progress.total_on_disk()
			, calc_bytes(files, m_picker->have_want()));
		st.total_done = calc_bytes(files, m_picker->have());
		st.total = calc_bytes(files, m_picker->all_pieces());

		TORRENT_ASSERT(st.total_done <= calc_bytes(files, m_picker->all_pieces()));
		TORRENT_ASSERT(st.total_wanted <= calc_bytes(files, m_picker->all_pieces()));

		TORRENT_ASSERT(st.total_wanted_done >= 0);
		TORRENT_ASSERT(st.total_wanted >= 0);
		TORRENT_ASSERT(st.total_wanted >= st.total_wanted_done);
		TORRENT_ASSERT(st.total_done >= 0);
		TORRENT_ASSERT(st.total_done >= st.total_wanted_done);

		// this is expensive, we might not want to do it all the time
		if (!(flags & torrent_handle::query_accurate_download_counters)) return;

		// to get higher accuracy of the download progress, include
		// blocks from currently downloading pieces as well
		std::vector<piece_picker::downloading_piece> const dl_queue
			= m_picker->get_download_queue();

		// look at all unfinished pieces and add the completed
		// blocks to our 'done' counter
		for (auto i = dl_queue.begin(); i != dl_queue.end(); ++i)
		{
			piece_index_t const index = i->index;

			// completed pieces are already accounted for
			if (m_picker->have_piece(index)) continue;

			TORRENT_ASSERT(i->finished + i->writing <= m_picker->blocks_in_piece(index));

			auto const additional_bytes = std::int64_t(i->finished + i->writing
				- m_picker->pad_bytes_in_piece(index) / block_size())
				* block_size();
			TORRENT_ASSERT(additional_bytes >= 0);
			st.total_done += additional_bytes;
			if (m_picker->piece_priority(index) > dont_download)
				st.total_wanted_done += additional_bytes;
		}

		TORRENT_ASSERT(st.total_wanted_done >= 0);
		TORRENT_ASSERT(st.total_done >= st.total_wanted_done);
	}